

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenX86.cc
# Opt level: O1

void __thiscall mcc::CodeGenX86::GenCondJump(CodeGenX86 *this,int r,TokenType type,int label)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  
  poVar1 = this->out_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\ttest\t",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,this->kRegisters[r]._M_dataplus._M_p,
                      this->kRegisters[r]._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,this->kRegisters[r]._M_dataplus._M_p,
                      this->kRegisters[r]._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if (type == T_OR) {
    poVar1 = this->out_;
    pcVar3 = "\tjne\tL";
    lVar2 = 6;
  }
  else {
    if (type != T_AND) {
      poVar1 = std::operator<<((ostream *)&std::cerr,
                               "Internal error: unexpected operator type in logical expr");
      poVar1 = operator<<(poVar1,type);
      std::endl<char,std::char_traits<char>>(poVar1);
      exit(1);
    }
    poVar1 = this->out_;
    pcVar3 = "\tje\tL";
    lVar2 = 5;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,label);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void CodeGenX86::GenCondJump(int r, TokenType type, int label) {
  out_ << "\ttest\t" << kRegisters[r] << ", " << kRegisters[r] << "\n";
  if (type == TokenType::T_AND) {
    out_ << "\tje\tL" << label << "\n";
  } else if (type == TokenType::T_OR) {
    out_ << "\tjne\tL" << label << "\n";
  } else {
    std::cerr << "Internal error: unexpected operator type in logical expr" << type << std::endl;
    exit(1);
  }
}